

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_section.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  ostream *poVar2;
  section *psVar3;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [8];
  note_section_accessor note_writer;
  string local_100;
  section *local_e0;
  section *note_sec;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  elfio reader;
  char **argv_local;
  int argc_local;
  
  reader.current_file_pos = (Elf_Xword)argv;
  if (argc == 2) {
    ELFIO::elfio::elfio((elfio *)local_a0);
    __s = *(char **)(reader.current_file_pos + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_c1);
    bVar1 = ELFIO::elfio::load((elfio *)local_a0,&local_c0,false);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,".note.ELFIO",
                 (allocator<char> *)
                 ((long)&note_writer.note_start_positions.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      psVar3 = ELFIO::elfio::Sections::add((Sections *)local_a0,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&note_writer.note_start_positions.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      local_e0 = psVar3;
      (*psVar3->_vptr_section[6])(psVar3,&ELFIO::SHT_NOTE);
      ELFIO::note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
      note_section_accessor_template
                ((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> *)
                 local_130,(elfio *)local_a0,local_e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Created by ELFIO",&local_151);
      ELFIO::note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::add_note
                ((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> *)
                 local_130,1,&local_150,"My data",8);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"./result.elf",&local_179);
      ELFIO::elfio::save((elfio *)local_a0,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      argv_local._4_4_ = 0;
      note_sec._0_4_ = 1;
      ELFIO::note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
      ~note_section_accessor_template
                ((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> *)
                 local_130);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t find or process ELF file ");
      poVar2 = std::operator<<(poVar2,*(char **)(reader.current_file_pos + 8));
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 2;
      note_sec._0_4_ = 1;
    }
    ELFIO::elfio::~elfio((elfio *)local_a0);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: add_section <elf_file>");
    std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 2 ) {
        std::cout << "Usage: add_section <elf_file>" << std::endl;
        return 1;
    }

    // Create an elfio reader
    elfio reader;

    // Load ELF data
    if ( !reader.load( argv[1] ) ) {
        std::cout << "Can't find or process ELF file " << argv[1] << std::endl;
        return 2;
    }

    // Create additional section at the end of the file
    section* note_sec = reader.sections.add( ".note.ELFIO" );
    note_sec->set_type( SHT_NOTE );
    note_section_accessor note_writer( reader, note_sec );
    note_writer.add_note( 0x01, "Created by ELFIO", "My data", 8 );

    reader.save( "./result.elf" );

    return 0;
}